

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O0

Gia_Man_t * Gia_ManFront(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  uint local_58;
  int iFront;
  int nCrossCutMaxInit;
  int nCrossCutMax;
  int nCrossCut;
  int iLit;
  int i;
  char *pFront;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pFanin1New;
  Gia_Obj_t *pFanin0New;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iFront = 0;
  iVar1 = Gia_ManCrossCutSimple(p);
  Gia_ManCreateValueRefs(p);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar2);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p_00->nFront = (int)((float)iVar1 * 1.1) + 1;
  pcVar5 = (char *)calloc((long)p_00->nFront,1);
  local_58 = Gia_ManFrontFindNext(pcVar5,p_00->nFront,0);
  pGVar6 = Gia_ManConst0(p_00);
  pGVar6->Value = local_58;
  pGVar6 = Gia_ManConst0(p);
  iVar2 = Gia_ObjValue(pGVar6);
  if (iVar2 == 0) {
    pcVar5[(int)local_58] = '\0';
  }
  nCrossCutMaxInit = (int)(iVar2 != 0);
  nCrossCut = 1;
  do {
    bVar9 = false;
    if (nCrossCut < p->nObjs) {
      pFanin0New = Gia_ManObj(p,nCrossCut);
      bVar9 = pFanin0New != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) {
      if (p_00->nObjs != p->nObjs) {
        __assert_fail("pNew->nObjs == p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                      ,0xf0,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      if ((nCrossCutMaxInit != 0) && (iFront != iVar1)) {
        __assert_fail("nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                      ,0xf1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      nCrossCut = 0;
      while( true ) {
        if (p_00->nFront <= nCrossCut) {
          if (pcVar5 != (char *)0x0) {
            free(pcVar5);
          }
          iVar1 = Gia_ManRegNum(p);
          Gia_ManSetRegNum(p_00,iVar1);
          return p_00;
        }
        if (pcVar5[nCrossCut] != '\0') break;
        nCrossCut = nCrossCut + 1;
      }
      __assert_fail("pFront[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                    ,0xf3,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
    }
    iVar2 = Gia_ObjIsCi(pFanin0New);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo(pFanin0New);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjValue(pFanin0New);
        if ((iVar2 != 0) && (nCrossCutMaxInit = nCrossCutMaxInit + 1, iFront < nCrossCutMaxInit)) {
          iFront = nCrossCutMaxInit;
        }
        pGVar6 = Gia_ManAppendObj(p_00);
        iVar2 = Gia_ObjId(p_00,pGVar6);
        iVar3 = Gia_ObjId(p,pFanin0New);
        if (iVar2 != iVar3) {
          __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xd4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        iVar2 = Gia_ObjFaninId0(pFanin0New,nCrossCut);
        pGVar7 = Gia_ManObj(p_00,iVar2);
        if (pGVar7->Value == 0x1fffffff) {
          __assert_fail("pFanin0New->Value != GIA_NONE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xd7,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffe0000000 | (ulong)pGVar7->Value & 0x1fffffff
        ;
        uVar4 = Gia_ObjFaninC0(pFanin0New);
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffdfffffff | ((ulong)uVar4 & 1) << 0x1d;
        iVar2 = Gia_ObjFaninId1(pFanin0New,nCrossCut);
        pGVar8 = Gia_ManObj(p_00,iVar2);
        if (pGVar8->Value == 0x1fffffff) {
          __assert_fail("pFanin1New->Value != GIA_NONE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xdc,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        *(ulong *)pGVar6 =
             *(ulong *)pGVar6 & 0xe0000000ffffffff | ((ulong)pGVar8->Value & 0x1fffffff) << 0x20;
        uVar4 = Gia_ObjFaninC1(pFanin0New);
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xdfffffffffffffff | ((ulong)uVar4 & 1) << 0x3d;
        local_58 = Gia_ManFrontFindNext(pcVar5,p_00->nFront,local_58);
        pGVar6->Value = local_58;
        pGVar6 = Gia_ObjFanin0(pFanin0New);
        uVar4 = pGVar6->Value - 1;
        pGVar6->Value = uVar4;
        if (uVar4 == 0) {
          pcVar5[pGVar7->Value] = '\0';
          nCrossCutMaxInit = nCrossCutMaxInit + -1;
        }
        pGVar6 = Gia_ObjFanin1(pFanin0New);
        uVar4 = pGVar6->Value - 1;
        pGVar6->Value = uVar4;
        if (uVar4 == 0) {
          pcVar5[pGVar8->Value] = '\0';
          nCrossCutMaxInit = nCrossCutMaxInit + -1;
        }
        iVar2 = Gia_ObjValue(pFanin0New);
        if (iVar2 == 0) {
          pcVar5[(int)local_58] = '\0';
        }
      }
      else {
        iVar2 = Gia_ObjValue(pFanin0New);
        if (iVar2 != 0) {
          __assert_fail("Gia_ObjValue(pObj) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xbd,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        iVar2 = Gia_ManAppendCo(p_00,0);
        iVar2 = Abc_Lit2Var(iVar2);
        pGVar6 = Gia_ManObj(p_00,iVar2);
        iVar2 = Gia_ObjId(p_00,pGVar6);
        iVar3 = Gia_ObjId(p,pFanin0New);
        if (iVar2 != iVar3) {
          __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xc1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        iVar2 = Gia_ObjFaninId0(pFanin0New,nCrossCut);
        pGVar7 = Gia_ManObj(p_00,iVar2);
        if (pGVar7->Value == 0x1fffffff) {
          __assert_fail("pFanin0New->Value != GIA_NONE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                        ,0xc4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        pGVar6->Value = 0x1fffffff;
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffe0000000 | (ulong)pGVar7->Value & 0x1fffffff
        ;
        uVar4 = Gia_ObjFaninC0(pFanin0New);
        *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffdfffffff | ((ulong)uVar4 & 1) << 0x1d;
        pGVar6 = Gia_ObjFanin0(pFanin0New);
        uVar4 = pGVar6->Value - 1;
        pGVar6->Value = uVar4;
        if (uVar4 == 0) {
          pcVar5[pGVar7->Value] = '\0';
          nCrossCutMaxInit = nCrossCutMaxInit + -1;
        }
      }
    }
    else {
      iVar2 = Gia_ObjValue(pFanin0New);
      if ((iVar2 != 0) && (nCrossCutMaxInit = nCrossCutMaxInit + 1, iFront < nCrossCutMaxInit)) {
        iFront = nCrossCutMaxInit;
      }
      iVar2 = Gia_ManAppendCi(p_00);
      iVar2 = Abc_Lit2Var(iVar2);
      pGVar6 = Gia_ManObj(p_00,iVar2);
      iVar2 = Gia_ObjId(p_00,pGVar6);
      iVar3 = Gia_ObjId(p,pFanin0New);
      if (iVar2 != iVar3) {
        __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFront.c"
                      ,0xb4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      local_58 = Gia_ManFrontFindNext(pcVar5,p_00->nFront,local_58);
      pGVar6->Value = local_58;
      iVar2 = Gia_ObjValue(pFanin0New);
      if (iVar2 == 0) {
        pcVar5[(int)local_58] = '\0';
      }
    }
    nCrossCut = nCrossCut + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFront( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFanin0New, * pFanin1New, * pObjNew;
    char * pFront;    // places used for the frontier
    int i, iLit, nCrossCut = 0, nCrossCutMax = 0;
    int nCrossCutMaxInit = Gia_ManCrossCutSimple( p );
    int iFront = 0;//, clk = Abc_Clock(); 
    // set references for all objects
    Gia_ManCreateValueRefs( p );
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nFront = 1 + (int)((float)1.1 * nCrossCutMaxInit); 
    // start the frontier
    pFront = ABC_CALLOC( char, pNew->nFront );
    // add constant node
    Gia_ManConst0(pNew)->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
    if ( Gia_ObjValue(Gia_ManConst0(p)) == 0 )
        pFront[iFront] = 0;
    else
        nCrossCut = 1;
    // iterate through the objects
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
                nCrossCutMax = nCrossCut;
            // create new node
            iLit = Gia_ManAppendCi( pNew );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
            // handle CIs without fanout
            if ( Gia_ObjValue(pObj) == 0 )
                pFront[iFront] = 0;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == 0 );
            // create new node
            iLit = Gia_ManAppendCo( pNew, 0 );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            // get the fanin
            pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
            assert( pFanin0New->Value != GIA_NONE );
            pObjNew->Value = GIA_NONE;
            pObjNew->iDiff0 = pFanin0New->Value;
            pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
            // deref the fanin
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
            {
                pFront[pFanin0New->Value] = 0;
                nCrossCut--;
            }
            continue;
        }
        if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
            nCrossCutMax = nCrossCut;
        // create new node
        pObjNew = Gia_ManAppendObj( pNew );
        assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
        // assign the first fanin
        pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
        assert( pFanin0New->Value != GIA_NONE );
        pObjNew->iDiff0 = pFanin0New->Value;
        pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
        // assign the second fanin
        pFanin1New = Gia_ManObj( pNew, Gia_ObjFaninId1(pObj, i) );
        assert( pFanin1New->Value != GIA_NONE );
        pObjNew->iDiff1 = pFanin1New->Value;
        pObjNew->fCompl1 = Gia_ObjFaninC1(pObj);
        // assign the frontier number
        pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
        // deref the fanins
        if ( --Gia_ObjFanin0(pObj)->Value == 0 )
        {
            pFront[pFanin0New->Value] = 0;
            nCrossCut--;
        }
        if ( --Gia_ObjFanin1(pObj)->Value == 0 )
        {
            pFront[pFanin1New->Value] = 0;
            nCrossCut--;
        }
        // handle nodes without fanout (choice nodes)
        if ( Gia_ObjValue(pObj) == 0 )
            pFront[iFront] = 0;
    }
    assert( pNew->nObjs == p->nObjs );
    assert( nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit );
    for ( i = 0; i < pNew->nFront; i++ )
        assert( pFront[i] == 0 );
    ABC_FREE( pFront );
//printf( "Crosscut = %6d. Frontier = %6d. ", nCrossCutMaxInit, pNew->nFront );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}